

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void comment_cb(Fl_Text_Editor *i,void *v)

{
  Fl_Type *this;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  Fl_Window *pFVar4;
  Fl_Type **ppFVar5;
  
  if ((char *)v != "LOAD") {
    pcVar2 = Fl_Text_Buffer::text((i->super_Fl_Text_Display).mBuffer);
    bVar1 = false;
    pcVar3 = c_check(pcVar2,0);
    if (pcVar3 != (char *)0x0) {
      fl_message("Error in comment: %s",pcVar3);
      pFVar4 = Fl_Widget::window((Fl_Widget *)i);
      if (pFVar4 != (Fl_Window *)0x0) {
        pFVar4 = Fl_Widget::window((Fl_Widget *)i);
        Fl_Window::make_current(pFVar4);
      }
      haderror = 1;
    }
    ppFVar5 = &Fl_Type::first;
    while (this = *ppFVar5, this != (Fl_Type *)0x0) {
      if (this->selected != '\0') {
        Fl_Type::comment(this,pcVar2);
        bVar1 = true;
      }
      ppFVar5 = &this->next;
    }
    if (bVar1) {
      set_modflag(1);
    }
    free(pcVar2);
    return;
  }
  pcVar2 = (current_widget->super_Fl_Type).comment_;
  pcVar3 = "";
  if (pcVar2 != (char *)0x0) {
    pcVar3 = pcVar2;
  }
  Fl_Text_Buffer::text((i->super_Fl_Text_Display).mBuffer,pcVar3);
  return;
}

Assistant:

void comment_cb(Fl_Text_Editor* i, void *v) {
  if (v == LOAD) {
    const char *cmttext = current_widget->comment();
    i->buffer()->text( cmttext ? cmttext : "" );
  } else {
    int mod = 0;
    char *c = i->buffer()->text();
    const char *d = c_check(c);
    if (d) {
      fl_message("Error in comment: %s",d);
      if (i->window()) i->window()->make_current();
      haderror = 1;
    }
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected) {
        o->comment(c);
        mod = 1;
      }
    }
    if (mod) set_modflag(1);
    free(c);
  }
}